

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

int64_t memory_tree_ns::pick_nearest(memory_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  uint64_t *puVar1;
  int iVar2;
  node *pnVar3;
  size_t sVar4;
  example *peVar5;
  uint *puVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  
  pnVar3 = (b->nodes)._begin;
  puVar6 = pnVar3[cn].examples_index._begin;
  if (pnVar3[cn].examples_index._end == puVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  else {
    uVar9 = 0xffffffffffffffff;
    uVar8 = 0;
    fVar10 = -3.4028235e+38;
    do {
      uVar7 = (ulong)puVar6[uVar8];
      iVar2 = b->learn_at_leaf;
      sVar4 = b->current_pass;
      fVar11 = normalized_linear_prod(b,ec,(b->examples)._begin[uVar7]);
      if ((iVar2 == 1) && (sVar4 != 0)) {
        diag_kronecker_product_test(ec,(b->examples)._begin[uVar7],b->kprod_ec,b->oas);
        peVar5 = b->kprod_ec;
        (peVar5->l).cs.costs._begin = (wclass *)0x7f7fffff;
        (peVar5->l).simple.initial = fVar11;
        peVar5 = b->kprod_ec;
        iVar2 = (int)b->max_routers;
        puVar1 = &(peVar5->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar2);
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar5)
        ;
        puVar1 = &(peVar5->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar2 * *(int *)(base + 0xe0));
        fVar11 = b->kprod_ec->partial_prediction;
      }
      if (fVar11 <= fVar10) {
        fVar11 = fVar10;
        uVar7 = uVar9;
      }
      uVar9 = uVar7;
      uVar8 = uVar8 + 1;
      pnVar3 = (b->nodes)._begin;
      puVar6 = pnVar3[cn].examples_index._begin;
      fVar10 = fVar11;
    } while (uVar8 < (ulong)((long)pnVar3[cn].examples_index._end - (long)puVar6 >> 2));
  }
  return uVar9;
}

Assistant:

int64_t pick_nearest(memory_tree& b, single_learner& base, const uint32_t cn, example& ec)
    {
        if (b.nodes[cn].examples_index.size() > 0)
        {
            float max_score = -FLT_MAX;
            int64_t max_pos = -1;
            for(size_t i = 0; i < b.nodes[cn].examples_index.size(); i++)
            {
                float score = 0.f;
                uint32_t loc = b.nodes[cn].examples_index[i];

                //do not use reward to update memory tree during the very first pass 
                //(which is for unsupervised training for memory tree)
                if (b.learn_at_leaf == true && b.current_pass >= 1){ 
                    float tmp_s = normalized_linear_prod(b, &ec, b.examples[loc]);
                    diag_kronecker_product_test(ec, *b.examples[loc], *b.kprod_ec, b.oas );
                    b.kprod_ec->l.simple = {FLT_MAX, 0., tmp_s};
                    base.predict(*b.kprod_ec, b.max_routers);
                    score = b.kprod_ec->partial_prediction;
                }
                else
                    score = normalized_linear_prod(b, &ec, b.examples[loc]);
                
                if (score > max_score){
                    max_score = score;
                    max_pos = (int64_t)loc;
                }
            }
            return max_pos;
        }
        else
            return -1;
    }